

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

int impl_GLSL_MaxUniforms(MOJOSHADER_shaderType shader_type)

{
  GLenum GVar1;
  GLint val;
  GLint local_c;
  
  local_c = 0;
  if (shader_type == MOJOSHADER_TYPE_VERTEX) {
    GVar1 = 0x8b4a;
  }
  else {
    if (shader_type != MOJOSHADER_TYPE_PIXEL) {
      return -1;
    }
    GVar1 = 0x8b49;
  }
  (*ctx->glGetIntegerv)(GVar1,&local_c);
  return local_c;
}

Assistant:

static int impl_GLSL_MaxUniforms(MOJOSHADER_shaderType shader_type)
{
    // these enums match between core 2.0 and the ARB extensions.
    GLenum pname = GL_NONE;
    GLint val = 0;
    if (shader_type == MOJOSHADER_TYPE_VERTEX)
        pname = GL_MAX_VERTEX_UNIFORM_COMPONENTS;
    else if (shader_type == MOJOSHADER_TYPE_PIXEL)
        pname = GL_MAX_FRAGMENT_UNIFORM_COMPONENTS;
    else
        return -1;

    ctx->glGetIntegerv(pname, &val);
    return (int) val;
}